

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscriber.cpp
# Opt level: O2

void __thiscall Subscriber::~Subscriber(Subscriber *this)

{
  this->_vptr_Subscriber = (_func_int **)&PTR_on_error_00140c70;
  if (-1 < this->fd) {
    close(this->fd);
  }
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

Subscriber::~Subscriber() {
  if (this->fd >= 0) {
    close(this->fd);
  }
}